

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ClearIniSettings(void)

{
  ImGuiSettingsHandler *pIVar1;
  code *pcVar2;
  ImGuiContext_conflict1 *pIVar3;
  long lVar4;
  long lVar5;
  
  pIVar3 = GImGui;
  ImGuiTextBuffer::clear(&GImGui->SettingsIniData);
  if (0 < (pIVar3->SettingsHandlers).Size) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      pIVar1 = (pIVar3->SettingsHandlers).Data;
      pcVar2 = *(code **)((long)&pIVar1->ClearAllFn + lVar4);
      if (pcVar2 != (code *)0x0) {
        (*pcVar2)(pIVar3,(long)&pIVar1->TypeName + lVar4);
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x48;
    } while (lVar5 < (pIVar3->SettingsHandlers).Size);
  }
  return;
}

Assistant:

void ImGui::ClearIniSettings()
{
    ImGuiContext& g = *GImGui;
    g.SettingsIniData.clear();
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].ClearAllFn)
            g.SettingsHandlers[handler_n].ClearAllFn(&g, &g.SettingsHandlers[handler_n]);
}